

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void SimpleLoggerMgr::destroy(void)

{
  atomic<SimpleLoggerMgr_*> this;
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&instanceLock);
  this = instance;
  if (iVar1 == 0) {
    if (instance._M_b._M_p != (__pointer_type)0x0) {
      flushAllLoggers((SimpleLoggerMgr *)instance._M_b._M_p);
      ~SimpleLoggerMgr((SimpleLoggerMgr *)this._M_b._M_p);
      operator_delete((void *)this._M_b._M_p);
      instance._M_b._M_p = (__base_type)(__pointer_type)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&instanceLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SimpleLogger::LogElem::LogElem() : len(0), status(CLEAN) {
    memset(ctx, 0x0, MSG_SIZE);
}